

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void __thiscall cmCacheManager::CacheEntry::RemoveProperty(CacheEntry *this,string *prop)

{
  bool bVar1;
  CacheEntryType CVar2;
  allocator<char> local_31;
  string local_30;
  
  bVar1 = std::operator==(prop,"TYPE");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"STRING",&local_31);
    CVar2 = cmState::StringToCacheEntryType(&local_30);
    this->Type = CVar2;
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    bVar1 = std::operator==(prop,"VALUE");
    if (!bVar1) {
      cmPropertyMap::RemoveProperty(&this->Properties,prop);
      return;
    }
    (this->Value)._M_string_length = 0;
    *(this->Value)._M_dataplus._M_p = '\0';
  }
  return;
}

Assistant:

void cmCacheManager::CacheEntry::RemoveProperty(const std::string& prop)
{
  if (prop == "TYPE") {
    this->Type = cmState::StringToCacheEntryType("STRING");
  } else if (prop == "VALUE") {
    this->Value.clear();
  } else {
    this->Properties.RemoveProperty(prop);
  }
}